

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O0

int auxstatus(lua_State *L,lua_State *co)

{
  int iVar1;
  undefined1 local_a8 [8];
  lua_Debug ar;
  lua_State *co_local;
  lua_State *L_local;
  
  if (L == co) {
    L_local._4_4_ = 0;
  }
  else {
    ar.i_ci = (CallInfo *)co;
    iVar1 = lua_status(co);
    if (iVar1 == 0) {
      iVar1 = lua_getstack((lua_State *)ar.i_ci,0,(lua_Debug *)local_a8);
      if (iVar1 == 0) {
        iVar1 = lua_gettop((lua_State *)ar.i_ci);
        if (iVar1 == 0) {
          L_local._4_4_ = 1;
        }
        else {
          L_local._4_4_ = 2;
        }
      }
      else {
        L_local._4_4_ = 3;
      }
    }
    else if (iVar1 == 1) {
      L_local._4_4_ = 2;
    }
    else {
      L_local._4_4_ = 1;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int auxstatus (lua_State *L, lua_State *co) {
  if (L == co) return COS_RUN;
  else {
    switch (lua_status(co)) {
      case LUA_YIELD:
        return COS_YIELD;
      case LUA_OK: {
        lua_Debug ar;
        if (lua_getstack(co, 0, &ar))  /* does it have frames? */
          return COS_NORM;  /* it is running */
        else if (lua_gettop(co) == 0)
            return COS_DEAD;
        else
          return COS_YIELD;  /* initial state */
      }
      default:  /* some error occurred */
        return COS_DEAD;
    }
  }
}